

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QTable.cpp
# Opt level: O2

void QTable::Load(string *filename,size_t nrRows,size_t nrColumns,QTable *Q)

{
  ostream *poVar1;
  istream *piVar2;
  E *pEVar3;
  long lVar4;
  size_t sVar5;
  size_t local_3f8;
  double q;
  string buffer;
  ifstream fp;
  byte abStack_398 [488];
  istringstream is;
  
  std::ifstream::ifstream(&fp,(filename->_M_dataplus)._M_p,_S_in);
  if ((abStack_398[*(long *)(_fp + -0x18)] & 5) != 0) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"QTable::Load: failed to ");
    poVar1 = std::operator<<(poVar1,"open file ");
    poVar1 = std::operator<<(poVar1,(string *)filename);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  boost::numeric::ublas::
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  ::resize(&Q->super_matrix_t,nrRows,nrColumns,true);
  buffer._M_dataplus._M_p = (pointer)&buffer.field_2;
  lVar4 = 0;
  local_3f8 = 0;
  buffer._M_string_length = 0;
  buffer.field_2._M_local_buf[0] = '\0';
  while( true ) {
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&fp,(string *)&buffer);
    if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 2) != 0) {
      if (local_3f8 == nrRows) {
        std::__cxx11::string::~string((string *)&buffer);
        std::ifstream::~ifstream(&fp);
        return;
      }
      pEVar3 = (E *)__cxa_allocate_exception(0x28);
      E::E(pEVar3,"QTable::Load wrong number of rows");
      __cxa_throw(pEVar3,&E::typeinfo,E::~E);
    }
    std::__cxx11::istringstream::istringstream((istringstream *)&is,(string *)&buffer,_S_in);
    sVar5 = 0;
    while( true ) {
      piVar2 = std::istream::_M_extract<double>((double *)&is);
      if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
      *(double *)
       ((long)(Q->super_matrix_t).data_.data_ + sVar5 * 8 + (Q->super_matrix_t).size2_ * lVar4) = q;
      sVar5 = sVar5 + 1;
    }
    if (nrColumns != sVar5) break;
    local_3f8 = local_3f8 + 1;
    std::__cxx11::istringstream::~istringstream((istringstream *)&is);
    lVar4 = lVar4 + 8;
  }
  pEVar3 = (E *)__cxa_allocate_exception(0x28);
  E::E(pEVar3,"QTable::Load wrong number of columns");
  __cxa_throw(pEVar3,&E::typeinfo,E::~E);
}

Assistant:

void QTable::Load(const std::string &filename,
                  size_t nrRows,
                  size_t nrColumns,
                  QTable &Q)
{
    ifstream fp(filename.c_str());
    if(!fp)
    {
        cerr << "QTable::Load: failed to "
             << "open file " << filename << endl;            
    }

    size_t a,s;
    double q;

//    QTable Q(nrRows,nrColumns);
    try { 
        Q.resize(nrRows,nrColumns);
    }
    catch(std::bad_alloc &e)
    {
        cout << "QTable::Load ran out of memory resizing QTable" << endl;
        throw(e);
    }

    s=0;
    string buffer;
    while(!getline(fp,buffer).eof())
    {
        istringstream is(buffer);
        a=0;
        while(is >> q)
            Q(s,a++)=q;

        if(a!=nrColumns)
            throw(E("QTable::Load wrong number of columns"));

        s++;
    }
    
    if(s!=nrRows)
        throw(E("QTable::Load wrong number of rows"));
}